

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_AddCircleFilled
               (ImDrawList *self,ImVec2 centre,float radius,ImU32 col,int num_segments)

{
  int num_segments_local;
  ImU32 col_local;
  float radius_local;
  ImDrawList *self_local;
  ImVec2 centre_local;
  
  self_local = (ImDrawList *)centre;
  ImDrawList::AddCircleFilled(self,(ImVec2 *)&self_local,radius,col,num_segments);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddCircleFilled (ImDrawList *larg1, ImVec2 const *larg2, float larg3, ImU32 *larg4, int larg5) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  float arg3 ;
  ImU32 arg4 ;
  int arg5 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = larg3;
  arg4 = *larg4;
  arg5 = larg5;
  try {
    ImDrawList_AddCircleFilled(arg1,arg2,arg3,arg4,arg5);
    
  } catch (...) {
    
  }
}